

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::line_start(Fl_Text_Display *this,int pos)

{
  int startPos;
  Fl_Text_Buffer *pFVar1;
  Fl_Text_Buffer *this_00;
  int local_34;
  int local_30;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  int pos_local;
  Fl_Text_Display *this_local;
  
  retPos = pos;
  _retLines = this;
  if (this->mContinuousWrap == 0) {
    pFVar1 = buffer(this);
    this_local._4_4_ = Fl_Text_Buffer::line_start(pFVar1,retPos);
  }
  else {
    pFVar1 = buffer(this);
    this_00 = buffer(this);
    startPos = Fl_Text_Buffer::line_start(this_00,retPos);
    wrapped_line_counter
              (this,pFVar1,startPos,retPos,0x7fffffff,true,0,&retLineEnd,&retLineStart,&local_30,
               &local_34,true);
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::line_start(int pos) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int retLines, retPos, retLineStart, retLineEnd;

  /* If we're not wrapping, use the more efficient BufStartOfLine */
  if (!mContinuousWrap)
    return buffer()->line_start(pos);

  wrapped_line_counter(buffer(), buffer()->line_start(pos), pos, INT_MAX, true, 0,
                       &retPos, &retLines, &retLineStart, &retLineEnd);

  IS_UTF8_ALIGNED2(buffer(), retLineStart)
  return retLineStart;
}